

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkTransferPhases(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  int *__s;
  ulong uVar10;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xb54,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  uVar1 = pNtk->vPhases->nSize;
  pVVar4 = pNtk->vObjs;
  if (uVar1 != pVVar4->nSize) {
    __assert_fail("Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xb55,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkNew->vPhases != (Vec_Int_t *)0x0) {
    __assert_fail("pNtkNew->vPhases == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xb56,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar2 = pNtkNew->vObjs->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar8 = iVar2;
  }
  pVVar9->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = iVar2;
  memset(__s,0,(long)iVar2 << 2);
  pNtkNew->vPhases = pVVar9;
  if (0 < (int)uVar1) {
    ppvVar5 = pVVar4->pArray;
    uVar10 = 0;
    do {
      pvVar6 = ppvVar5[uVar10];
      if (((pvVar6 != (void *)0x0) && (lVar7 = *(long *)((long)pvVar6 + 0x40), lVar7 != 0)) &&
         ((*(byte *)(lVar7 + 0x14) & 0xf) != 0)) {
        if ((long)pNtk->vPhases->nSize <= (long)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = *(uint *)(lVar7 + 0x10);
        if (((int)uVar3 < 0) || (iVar2 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar3] = pNtk->vPhases->pArray[uVar10];
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar1);
  }
  return;
}

Assistant:

void Abc_NtkTransferPhases( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->vPhases != NULL );
    assert( Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk) );
    assert( pNtkNew->vPhases == NULL );
    pNtkNew->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtkNew) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy && !Abc_ObjIsNone( (Abc_Obj_t *)pObj->pCopy ) )
            Vec_IntWriteEntry( pNtkNew->vPhases, Abc_ObjId( (Abc_Obj_t *)pObj->pCopy ), Vec_IntEntry(pNtk->vPhases, i) );
}